

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pusher.cpp
# Opt level: O2

void push_boris(particle *p,vector3d *e_field,vector3d *b_field,double dt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  auVar11 = ZEXT816(0x3ff0000000000000);
  dVar12 = dt * 0.5 * p->cmr;
  dVar4 = dVar12 * e_field->x;
  dVar5 = dVar12 * e_field->y;
  dVar6 = dVar12 * e_field->z;
  dVar1 = dVar4 + p->ux;
  dVar2 = dVar5 + p->uy;
  dVar3 = dVar6 + p->uz;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar1;
  auVar14 = vfmadd213sd_fma(auVar15,auVar15,auVar11);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar2;
  auVar14 = vfmadd231sd_fma(auVar14,auVar17,auVar17);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar3;
  auVar14 = vfmadd231sd_fma(auVar14,auVar19,auVar19);
  auVar14 = vsqrtsd_avx(auVar14,auVar14);
  dVar12 = dVar12 / auVar14._0_8_;
  p->g = auVar14._0_8_;
  dVar7 = dVar12 * b_field->y;
  dVar8 = dVar12 * b_field->x;
  dVar12 = dVar12 * b_field->z;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar12;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar2;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar7 * dVar3;
  auVar14 = vfmsub231sd_fma(auVar24,auVar18,auVar13);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar3;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar8;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar12 * dVar1;
  auVar9 = vfmsub231sd_fma(auVar26,auVar20,auVar21);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar1;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar7;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar8 * dVar2;
  auVar10 = vfmsub231sd_fma(auVar28,auVar16,auVar23);
  dVar1 = auVar14._0_8_ + dVar1;
  dVar2 = auVar9._0_8_ + dVar2;
  dVar3 = auVar10._0_8_ + dVar3;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar3;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar1 * dVar12;
  auVar9 = vfmsub231sd_fma(auVar31,auVar21,auVar29);
  auVar14 = vfmadd213sd_fma(auVar21,auVar21,auVar11);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar1;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar8 * dVar2;
  auVar10 = vfmsub231sd_fma(auVar32,auVar25,auVar23);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar2;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar7 * dVar3;
  auVar15 = vfmsub231sd_fma(auVar30,auVar27,auVar13);
  auVar14 = vfmadd231sd_fma(auVar14,auVar23,auVar23);
  auVar14 = vfmadd231sd_fma(auVar14,auVar13,auVar13);
  auVar22._0_8_ = 2.0 / auVar14._0_8_;
  auVar22._8_8_ = 0x4000000000000000;
  auVar14 = vfmadd213sd_fma(auVar15,auVar22,auVar16);
  auVar9 = vfmadd213sd_fma(auVar9,auVar22,auVar18);
  auVar10 = vfmadd213sd_fma(auVar10,auVar22,auVar20);
  dVar4 = auVar14._0_8_ + dVar4;
  dVar5 = auVar9._0_8_ + dVar5;
  dVar6 = auVar10._0_8_ + dVar6;
  p->ux = dVar4;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar4;
  auVar14 = vfmadd213sd_fma(auVar14,auVar14,auVar11);
  p->uy = dVar5;
  p->uz = dVar6;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar5;
  auVar14 = vfmadd231sd_fma(auVar14,auVar10,auVar10);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar6;
  auVar14 = vfmadd231sd_fma(auVar14,auVar9,auVar9);
  auVar14 = vsqrtsd_avx(auVar14,auVar14);
  p->g = auVar14._0_8_;
  return;
}

Assistant:

void push_boris(particle & p, vector3d& e_field, vector3d& b_field, double dt)
{
    // See Birdsall, Langdon, "Plasma Physics via Computer Simulation"
    vector3d e;
    vector3d b;
    double tmp;
    double u1x, u1y, u1z;
    double wx,wy,wz;
    double & cmr = p.cmr;
    double & ux = p.ux;
    double & uy = p.uy;
    double & uz = p.uz;
    double & g = p.g;
    tmp = 0.5 * dt * cmr;

    //e = dt qE/2m
    e.x = e_field.x*tmp;
    e.y = e_field.y*tmp;
    e.z = e_field.z*tmp;
    //

    // u- = u0 + e
    u1x = ux + e.x;
    u1y = uy + e.y;
    u1z = uz + e.z;

    // gamma^2 = 1 + (u-)^2
    g = sqrt(1 + u1x * u1x + u1y * u1y + u1z * u1z);

    tmp /= g;
    // b = dt qB/2mc
    b.x = b_field.x*tmp;
    b.y = b_field.y*tmp;
    b.z = b_field.z*tmp;

    // u' = u- + [u-, b]
    wx = u1x + (u1y * b.z - u1z * b.y);
    wy = u1y + (u1z * b.x - u1x * b.z);
    wz = u1z + (u1x * b.y - u1y * b.x);

    tmp = 2 / (1 + b.x * b.x + b.y * b.y + b.z * b.z);

    // u+ = u- + 2 * [u, b] / (1 + b^2)
    u1x += (wy * b.z - wz * b.y) * tmp;
    u1y += (wz * b.x - wx * b.z) * tmp;
    u1z += (wx * b.y - wy * b.x) * tmp;

    // u1 = u+ + e
    ux = u1x + e.x;
    uy = u1y + e.y;
    uz = u1z + e.z;

    g = sqrt(1 + ux * ux + uy * uy + uz * uz);
}